

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FloatBitsToUintIntCase::getInputValues
          (FloatBitsToUintIntCase *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  pointer pSVar3;
  void *pvVar4;
  deUint32 dVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  Vec2 ranges [3];
  Random rnd;
  float local_58 [8];
  deRandom local_38;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar5 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_38,dVar5 ^ 0x2790a);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)(pSVar3->varType).m_data.basic.precision;
  iVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (0 < iVar6 * numValues) {
    fVar1 = local_58[uVar7 * 2];
    pvVar4 = *values;
    fVar2 = local_58[uVar7 * 2 + 1];
    uVar7 = 0;
    do {
      fVar8 = deRandom_getFloat(&local_38);
      *(float *)((long)pvVar4 + uVar7 * 4) = fVar8 * (fVar2 - fVar1) + fVar1;
      uVar7 = uVar7 + 1;
    } while ((uint)(iVar6 * numValues) != uVar7);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x2790au);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), values[0], numValues*scalarSize);
	}